

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

int telnet_exitcode(Backend *be)

{
  int iVar1;
  
  if (be[-10].vt != (BackendVtable *)0x0) {
    return -1;
  }
  iVar1 = 0x7fffffff;
  if (*(char *)((long)&be[-10].interactor + 1) == '\0') {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int telnet_exitcode(Backend *be)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    if (telnet->s != NULL)
        return -1;                     /* still connected */
    else if (telnet->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* Telnet doesn't transmit exit codes back to the client */
        return 0;
}